

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O3

int8_t msocket_unix_connect(msocket_t *self,char *socketPath)

{
  int8_t iVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  size_t __n;
  char *__dest;
  undefined1 local_7e [18];
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 uStack_2c;
  undefined4 uStack_24;
  undefined4 local_20;
  undefined4 uStack_1c;
  undefined8 uStack_18;
  
  if ((self == (msocket_t *)0x0) || ((self->socketMode & 2) != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
  }
  else if (self->handlerTable == (msocket_handler_t *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0xe;
  }
  else {
    uStack_1c = 0;
    uStack_18 = 0;
    uStack_2c = 0;
    uStack_24 = 0;
    local_20 = 0;
    local_3c = 0;
    uStack_34 = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_5c = 0;
    uStack_54 = 0;
    local_6c = 0;
    uStack_64 = 0;
    local_7e[2] = '\0';
    local_7e[3] = '\0';
    local_7e[4] = '\0';
    local_7e[5] = '\0';
    local_7e[6] = '\0';
    local_7e[7] = '\0';
    local_7e[8] = '\0';
    local_7e[9] = '\0';
    local_7e._10_8_ = 0;
    local_7e._0_2_ = 1;
    if (*socketPath == '\0') {
      __dest = local_7e + 3;
      socketPath = socketPath + 1;
      __n = 0x6a;
    }
    else {
      __dest = local_7e + 2;
      __n = 0x6b;
    }
    strncpy(__dest,socketPath,__n);
    __fd = socket(1,1,0);
    if (-1 < __fd) {
      iVar2 = connect(__fd,(sockaddr *)local_7e,0x6e);
      if (iVar2 < 0) {
        close(__fd);
      }
      else {
        self->tcpsockfd = __fd;
        self->socketMode = self->socketMode | 2;
        self->state = '\x04';
        self->newConnection = '\x01';
        iVar1 = msocket_startIoThread(self);
        if (-1 < iVar1) {
          return '\0';
        }
        close(self->tcpsockfd);
        self->state = '\x06';
      }
    }
  }
  return -1;
}

Assistant:

int8_t msocket_unix_connect(msocket_t *self, const char *socketPath)
{
   if( (self != 0) && ( (self->socketMode & MSOCKET_MODE_TCP) == 0) ){
      int result;
      if (self->handlerTable == 0) {
         errno = EFAULT;
         return -1;
      }
#ifndef _WIN32
      result = msocket_connect_unix_internal(self, socketPath);
      if (result < 0) {
         //errno alredy set by system call
         return -1;
      }

      self->socketMode |= MSOCKET_MODE_TCP; //Treat connection the same way as if it was set to TCP
      self->state = MSOCKET_STATE_ESTABLISHED;
      self->newConnection = 1;
      result = msocket_startIoThread(self);
      if (result < 0) {
         SOCKET_CLOSE(self->tcpsockfd);
         self->state = MSOCKET_STATE_CLOSED;
         return -1;
      }
      return 0;
#else
      (void)socketPath;
      errno = EAFNOSUPPORT; //UNIX domain socket not supported in Windows
      result = -1;
#endif // !_WIN32
   }
   errno = EINVAL;
   return -1;
}